

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O2

void KeccakP1600_OverwriteBytes(void *state,uchar *data,uint offset,uint length)

{
  uint uVar1;
  uint uVar2;
  uint _sizeLeft;
  uint uVar3;
  ulong __n;
  
  if (offset != 0) {
    uVar2 = offset & 7;
    uVar3 = offset & 0xfffffff8;
    for (; length != 0; length = length - uVar1) {
      uVar1 = 8 - uVar2;
      if (length <= 8 - uVar2) {
        uVar1 = length;
      }
      memcpy((void *)((long)state + (ulong)uVar2 + (ulong)uVar3),data,(ulong)uVar1);
      data = data + uVar1;
      uVar3 = uVar3 + 8;
      uVar2 = 0;
    }
    return;
  }
  __n = (ulong)(length & 0xfffffff8);
  memcpy(state,data,__n);
  memcpy((void *)((long)state + __n),data + __n,(ulong)(length & 7));
  return;
}

Assistant:

void KeccakP1600_OverwriteBytes(void *state, const unsigned char *data, unsigned int offset, unsigned int length)
{
    SnP_OverwriteBytes(state, data, offset, length, KeccakP1600_OverwriteLanes, KeccakP1600_OverwriteBytesInLane, 8);
}